

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

int __thiscall StatisticsApp::run(StatisticsApp *this)

{
  string *delim;
  vector<bool,_std::allocator<bool>_> *this_00;
  DataFilters *this_01;
  ostream *stream;
  undefined8 uVar1;
  undefined4 uVar2;
  _Bvector_impl *p_Var3;
  ifstream *piVar4;
  int iVar5;
  ostream *poVar6;
  ostream *extraout_RAX;
  ostream *extraout_RAX_00;
  ostream *extraout_RAX_01;
  ostream *extraout_RAX_02;
  ostream *extraout_RAX_03;
  ostream *extraout_RAX_04;
  ostream *extraout_RAX_05;
  ostream *extraout_RAX_06;
  ostream *extraout_RAX_07;
  ostream *extraout_RAX_08;
  ostream *extraout_RAX_09;
  ostream *extraout_RAX_10;
  reference pvVar7;
  const_reference pvVar8;
  ostream *extraout_RAX_11;
  ostream *extraout_RAX_12;
  ostream *extraout_RAX_13;
  reference pvVar9;
  ostream *extraout_RAX_14;
  ostream *extraout_RAX_15;
  istream *extraout_RDX;
  istream *stream_00;
  istream *extraout_RDX_00;
  size_type sVar10;
  pointer pcVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  pointer __n;
  size_type sVar16;
  StatisticsApp *this_02;
  size_type sVar17;
  bool bVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  _Bit_iterator __first;
  _Bit_iterator __last;
  int local_57c;
  int local_578;
  allocator<char> local_571;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  ulong local_550;
  StringSplitter parser;
  DataVector data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  titles;
  string line;
  DataVector dataMasked;
  stringstream msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  undefined8 local_478;
  pointer local_308;
  ifstream *local_300;
  pointer local_2f8;
  StatisticsWriter writer;
  RowSampler sampler;
  string lineToReshape;
  string local_298 [32];
  string local_278;
  string local_258;
  ifstream fileInput;
  int aiStack_218 [122];
  
  this_02 = (StatisticsApp *)&fileInput;
  std::ifstream::ifstream((ifstream *)this_02,(this->_options).fileInput._M_dataplus._M_p,_S_in);
  iVar5 = *(int *)((long)aiStack_218 + *(long *)(_fileInput + -0x18));
  if (iVar5 != 0) {
    this_02 = (StatisticsApp *)&std::cin;
  }
  if (2 < (int)Logger::logLevel) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar6 = std::operator<<((ostream *)local_488._M_local_buf,
                             (string *)&ApplicationProperties::NAME_abi_cxx11_);
    poVar6 = std::operator<<(poVar6," is starting");
    std::endl<char,std::char_traits<char>>(poVar6);
    Logger::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    std::__cxx11::stringbuf::str();
    std::operator<<(extraout_RAX,(string *)&writer);
    std::__cxx11::string::~string((string *)&writer);
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  std::__cxx11::string::string<std::allocator<char>>(local_298,"#",(allocator<char> *)&msg);
  std::__cxx11::string::string((string *)&writer,local_298);
  std::__cxx11::string::~string(local_298);
  sampler._count = 0;
  sampler._next = 1;
  sampler._mode = (this->_options).sampling.mode;
  sampler._sampled = 0;
  sampler._step = (this->_options).sampling.step;
  titles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  titles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  titles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser._tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parser._tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parser._tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lineToReshape,"",(allocator<char> *)&msg);
  data.super_vector<DataPoint,_std::allocator<DataPoint>_>.
  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dataMasked.super_vector<DataPoint,_std::allocator<DataPoint>_>.
  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.super_vector<DataPoint,_std::allocator<DataPoint>_>.
  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  data.super_vector<DataPoint,_std::allocator<DataPoint>_>.
  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dataMasked.super_vector<DataPoint,_std::allocator<DataPoint>_>.
  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  dataMasked.super_vector<DataPoint,_std::allocator<DataPoint>_>.
  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (iVar5 == 0) {
    local_300 = &fileInput;
  }
  else {
    local_300 = (ifstream *)&std::cin;
  }
  local_300 = local_300 + 0x20;
  delim = &(this->_options).delimiter;
  this_00 = &(this->_options).filterColumns;
  this_01 = &(this->_options).filterRows;
  uVar14 = 0;
  uVar13 = 0;
  local_57c = 0;
  local_578 = 0;
  stream_00 = extraout_RDX;
  do {
    piVar4 = local_300;
    readline_abi_cxx11_(&line,this_02,stream_00);
    if (*(int *)(piVar4 + *(long *)(*(long *)&this_02->_options + -0x18)) == 0) {
      if (line._M_string_length == 0) {
        if ((this->_options).blankEOF == true) {
          bVar18 = true;
          if (4 < (int)Logger::logLevel) {
            std::__cxx11::stringstream::stringstream((stringstream *)&msg);
            poVar6 = std::operator<<((ostream *)local_488._M_local_buf,"Blank line found. Exiting.")
            ;
            std::endl<char,std::char_traits<char>>(poVar6);
            Logger::log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
            std::__cxx11::stringbuf::str();
            std::operator<<(extraout_RAX_01,(string *)&local_570);
            goto LAB_0017e06c;
          }
          goto LAB_0017e3a4;
        }
        if (4 < (int)Logger::logLevel) {
          std::__cxx11::stringstream::stringstream((stringstream *)&msg);
          poVar6 = std::operator<<((ostream *)local_488._M_local_buf,"Blank line found. Skipping.");
          std::endl<char,std::char_traits<char>>(poVar6);
          Logger::log((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
          std::__cxx11::stringbuf::str();
          std::operator<<(extraout_RAX_02,(string *)&local_570);
          std::__cxx11::string::~string((string *)&local_570);
          std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((string *)&line,0,1,(this->_options).comment._M_dataplus._M_p);
        if (iVar5 != 0) {
          if (uVar14 == 0) {
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"",&local_571);
          }
          else {
            std::__cxx11::string::string((string *)&local_570,(string *)delim);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                         &local_570,&line);
          std::__cxx11::string::append((string *)&lineToReshape,(string *)&msg);
          std::__cxx11::string::~string((string *)&msg);
          std::__cxx11::string::~string((string *)&local_570);
          uVar14 = uVar14 + 1;
          if ((this->_options).numLinesToReshape <= uVar14) {
            std::__cxx11::string::_M_assign((string *)&line,(string *)&lineToReshape);
            std::__cxx11::string::assign((string *)&lineToReshape,"");
            uVar13 = uVar13 + 1;
            if ((this->_options).headerRow == uVar13) {
              StringSplitter::initialize
                        (&parser,&line,delim,(this->_options).removeDuplicates,this_00);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&msg,&parser._tokens);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_move_assign(&titles,&msg);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&msg);
            }
            else {
              uVar14 = (this->_options).numLinesToSkip;
              if (uVar14 < uVar13) {
                if (uVar14 + (this->_options).numLinesToKeep < uVar13) {
                  uVar14 = 0;
                  bVar18 = true;
                  if (2 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
                    poVar6 = std::operator<<((ostream *)local_488._M_local_buf,
                                             "Skipping remaining lines.");
                    std::endl<char,std::char_traits<char>>(poVar6);
                    Logger::log((double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
                    std::__cxx11::stringbuf::str();
                    std::operator<<(extraout_RAX_03,(string *)&local_570);
                    goto LAB_0017e06c;
                  }
                  goto LAB_0017e3a4;
                }
                bVar18 = RowSampler::sample(&sampler);
                if (bVar18) {
                  local_488._M_allocated_capacity = 0;
                  local_488._8_8_ = 0;
                  _msg = (pointer)0x0;
                  local_478 = 0;
                  StringSplitter::initialize
                            (&parser,&line,delim,(this->_options).removeDuplicates,
                             (vector<bool,_std::allocator<bool>_> *)&msg);
                  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                            ((_Bvector_base<std::allocator<bool>_> *)&msg);
                  local_550 = (ulong)uVar13;
                  uVar15 = (long)parser._tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)parser._tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  if (4 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
                    poVar6 = std::operator<<((ostream *)local_488._M_local_buf,"Line = ");
                    poVar6 = std::ostream::_M_insert<unsigned_long>(poVar6,local_550);
                    poVar6 = std::operator<<(poVar6," - content =\"");
                    poVar6 = std::operator<<(poVar6,(string *)&line);
                    poVar6 = std::operator<<(poVar6,"\"");
                    std::endl<char,std::char_traits<char>>(poVar6);
                    Logger::log((double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
                    std::__cxx11::stringbuf::str();
                    std::operator<<(extraout_RAX_05,(string *)&local_570);
                    std::__cxx11::string::~string((string *)&local_570);
                    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
                  }
                  pcVar11 = (pointer)((long)uVar15 >> 5);
                  iVar5 = (int)pcVar11;
                  if (local_578 < 1) {
                    sVar10 = (size_type)(int)(uVar15 >> 5);
                    std::vector<DataPoint,_std::allocator<DataPoint>_>::resize
                              (&data.super_vector<DataPoint,_std::allocator<DataPoint>_>,sVar10);
                    std::vector<bool,_std::allocator<bool>_>::resize
                              (this_00,sVar10,
                               ((long)(this->_options).filterColumns.
                                      super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                      _M_p -
                               (long)(this->_options).filterColumns.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               ) * 8 + (ulong)*(uint *)((long)&(this->_options).filterColumns.
                                                                                                                              
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base + 8) == 0);
                    p_Var3 = &(this->_options).filterColumns.
                              super__Bvector_base<std::allocator<bool>_>._M_impl;
                    uVar1 = (p_Var3->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.
                            _M_p;
                    uVar2 = (p_Var3->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.
                            _M_offset;
                    __last.super__Bit_iterator_base._M_offset = uVar2;
                    __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar1;
                    __first.super__Bit_iterator_base._8_8_ = 0;
                    __first.super__Bit_iterator_base._M_p =
                         (this->_options).filterColumns.super__Bvector_base<std::allocator<bool>_>.
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                    __last.super__Bit_iterator_base._12_4_ = 0;
                    local_57c = std::accumulate<std::_Bit_iterator,int>(__first,__last,0);
                    std::vector<DataPoint,_std::allocator<DataPoint>_>::resize
                              (&dataMasked.super_vector<DataPoint,_std::allocator<DataPoint>_>,
                               (long)local_57c);
                    local_578 = iVar5;
                    if (2 < (int)Logger::logLevel) {
                      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
                      poVar6 = std::operator<<((ostream *)local_488._M_local_buf,
                                               "Data dimensions set to ");
                      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      Logger::log((double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
                      std::__cxx11::stringbuf::str();
                      std::operator<<(extraout_RAX_08,(string *)&local_570);
                      std::__cxx11::string::~string((string *)&local_570);
                      std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
                      if (2 < (int)Logger::logLevel) {
                        std::__cxx11::stringstream::stringstream((stringstream *)&msg);
                        poVar6 = std::operator<<((ostream *)local_488._M_local_buf,
                                                 "Mask dimensions set to ");
                        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_57c);
                        std::endl<char,std::char_traits<char>>(poVar6);
                        Logger::log((double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
                        std::__cxx11::stringbuf::str();
                        std::operator<<(extraout_RAX_09,(string *)&local_570);
                        std::__cxx11::string::~string((string *)&local_570);
                        std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
                      }
                    }
                  }
                  else if (local_578 != iVar5) {
                    if (1 < (int)Logger::logLevel) {
                      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
                      poVar6 = std::operator<<((ostream *)local_488._M_local_buf,"Line = ");
                      poVar6 = std::ostream::_M_insert<unsigned_long>(poVar6,local_550);
                      poVar6 = std::operator<<(poVar6,
                                               " - Statistics dimensions does not equal data dimensions."
                                              );
                      pcVar12 = "";
                      if ((this->_options).strictParsing != false) {
                        pcVar12 = " Skipping.";
                      }
                      poVar6 = std::operator<<(poVar6,pcVar12);
                      std::endl<char,std::char_traits<char>>(poVar6);
                      Logger::log((double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
                      std::__cxx11::stringbuf::str();
                      std::operator<<(extraout_RAX_06,(string *)&local_570);
                      std::__cxx11::string::~string((string *)&local_570);
                      std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
                    }
                    if ((this->_options).strictParsing != false) goto LAB_0017e3a1;
                  }
                  if (3 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
                    poVar6 = std::operator<<((ostream *)local_488._M_local_buf,"Line = ");
                    poVar6 = std::ostream::_M_insert<unsigned_long>(poVar6,local_550);
                    poVar6 = std::operator<<(poVar6," - Number of tokens found: ");
                    poVar6 = std::ostream::_M_insert<unsigned_long>(poVar6,(ulong)pcVar11);
                    std::endl<char,std::char_traits<char>>(poVar6);
                    Logger::log((double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
                    std::__cxx11::stringbuf::str();
                    std::operator<<(extraout_RAX_10,(string *)&local_570);
                    std::__cxx11::string::~string((string *)&local_570);
                    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
                  }
                  bVar18 = DataFilters::isFiltered(this_01,&parser._tokens);
                  if (bVar18) {
                    local_308 = (pointer)(long)local_578;
                    if (local_308 < pcVar11) {
                      pcVar11 = local_308;
                    }
                    for (__n = (pointer)0x0; pcVar11 != __n; __n = __n + 1) {
                      pvVar7 = std::vector<DataPoint,_std::allocator<DataPoint>_>::at
                                         (&data.super_vector<DataPoint,_std::allocator<DataPoint>_>,
                                          (size_type)__n);
                      bVar18 = StringSplitter::toValue<double>
                                         (&parser,(size_type)__n,&pvVar7->value);
                      pvVar7 = std::vector<DataPoint,_std::allocator<DataPoint>_>::at
                                         (&data.super_vector<DataPoint,_std::allocator<DataPoint>_>,
                                          (size_type)__n);
                      pvVar7->active = bVar18;
                      if (4 < (int)Logger::logLevel) {
                        std::__cxx11::stringstream::stringstream((stringstream *)&msg);
                        poVar6 = std::operator<<((ostream *)local_488._M_local_buf,"Line = ");
                        poVar6 = std::ostream::_M_insert<unsigned_long>(poVar6,local_550);
                        poVar6 = std::operator<<(poVar6," - ");
                        pvVar7 = std::vector<DataPoint,_std::allocator<DataPoint>_>::at
                                           (&data.
                                             super_vector<DataPoint,_std::allocator<DataPoint>_>,
                                            (size_type)__n);
                        pcVar12 = "Invalid token";
                        if (pvVar7->active != false) {
                          pcVar12 = "Valid token";
                        }
                        poVar6 = std::operator<<(poVar6,pcVar12);
                        poVar6 = std::operator<<(poVar6," = ");
                        pvVar8 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::at(&parser._tokens,(size_type)__n);
                        poVar6 = std::operator<<(poVar6,(string *)pvVar8);
                        std::endl<char,std::char_traits<char>>(poVar6);
                        Logger::log((double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
                        std::__cxx11::stringbuf::str();
                        std::operator<<(extraout_RAX_11,(string *)&local_570);
                        std::__cxx11::string::~string((string *)&local_570);
                        std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
                      }
                    }
                    bVar18 = DataFilters::isFiltered(this_01,&data);
                    if (bVar18) {
                      _msg = local_308;
                      local_570._M_dataplus._M_p = (pointer)(long)local_57c;
                      local_2f8 = local_308;
                      DataVector::copy((EVP_PKEY_CTX *)&data,(EVP_PKEY_CTX *)&msg);
                      if ((this->_options).showFilteredData == true) {
                        stream = this->_outputStream;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_258," ",(allocator<char> *)&msg);
                        StatisticsWriter::writeData(&writer,stream,&dataMasked,&local_258);
                        std::__cxx11::string::~string((string *)&local_258);
                      }
                      MultivariateTracker::update(&this->_tracker,&dataMasked);
                      DataVector::deactivate(&data);
                    }
                    else if (3 < (int)Logger::logLevel) {
                      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
                      poVar6 = std::operator<<((ostream *)local_488._M_local_buf,"Line = ");
                      poVar6 = std::ostream::_M_insert<unsigned_long>(poVar6,local_550);
                      poVar6 = std::operator<<(poVar6," - filtered out by numeric filter");
                      std::endl<char,std::char_traits<char>>(poVar6);
                      Logger::log((double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13));
                      std::__cxx11::stringbuf::str();
                      std::operator<<(extraout_RAX_13,(string *)&local_570);
                      goto LAB_0017e38a;
                    }
                  }
                  else if (3 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
                    poVar6 = std::operator<<((ostream *)local_488._M_local_buf,"Line = ");
                    poVar6 = std::ostream::_M_insert<unsigned_long>(poVar6,local_550);
                    poVar6 = std::operator<<(poVar6," - filtered out by string filter");
                    std::endl<char,std::char_traits<char>>(poVar6);
                    Logger::log((double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
                    std::__cxx11::stringbuf::str();
                    std::operator<<(extraout_RAX_12,(string *)&local_570);
                    goto LAB_0017e38a;
                  }
                }
                else if (4 < (int)Logger::logLevel) {
                  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
                  poVar6 = std::operator<<((ostream *)local_488._M_local_buf,
                                           "Row not sampled. Skipping");
                  std::endl<char,std::char_traits<char>>(poVar6);
                  Logger::log((double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
                  std::__cxx11::stringbuf::str();
                  std::operator<<(extraout_RAX_07,(string *)&local_570);
LAB_0017e38a:
                  std::__cxx11::string::~string((string *)&local_570);
                  std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
                }
              }
              else if (2 < (int)Logger::logLevel) {
                std::__cxx11::stringstream::stringstream((stringstream *)&msg);
                poVar6 = std::operator<<((ostream *)local_488._M_local_buf,"Skipping header line.");
                std::endl<char,std::char_traits<char>>(poVar6);
                Logger::log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
                std::__cxx11::stringbuf::str();
                std::operator<<(extraout_RAX_04,(string *)&local_570);
                goto LAB_0017e38a;
              }
            }
LAB_0017e3a1:
            bVar18 = false;
            uVar14 = 0;
            goto LAB_0017e3a4;
          }
        }
      }
      bVar18 = false;
    }
    else {
      bVar18 = true;
      if (4 < (int)Logger::logLevel) {
        std::__cxx11::stringstream::stringstream((stringstream *)&msg);
        poVar6 = std::operator<<((ostream *)local_488._M_local_buf,"End of file found. Exiting.");
        std::endl<char,std::char_traits<char>>(poVar6);
        Logger::log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        std::__cxx11::stringbuf::str();
        std::operator<<(extraout_RAX_00,(string *)&local_570);
LAB_0017e06c:
        bVar18 = true;
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
      }
    }
LAB_0017e3a4:
    std::__cxx11::string::~string((string *)&line);
    stream_00 = extraout_RDX_00;
    if (bVar18) {
      sVar10 = (size_type)local_57c;
      if ((long)titles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)titles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5 == sVar10) {
        if ((long)sVar10 < 1) {
          sVar10 = 0;
        }
      }
      else {
        if (((this->_options).headerRow != 0) && (0 < (int)Logger::logLevel)) {
          std::__cxx11::stringstream::stringstream((stringstream *)&msg);
          poVar6 = std::operator<<((ostream *)local_488._M_local_buf,
                                   "Size of header titles does not match data dimensions so using indices as header titles."
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
          Logger::log((double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15));
          std::__cxx11::stringbuf::str();
          std::operator<<(extraout_RAX_15,(string *)&line);
          std::__cxx11::string::~string((string *)&line);
          std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"",(allocator<char> *)&line);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&titles,sVar10,(value_type *)&msg);
        std::__cxx11::string::~string((string *)&msg);
        if ((long)sVar10 < 1) {
          sVar10 = 0;
        }
        sVar16 = 0;
        sVar17 = sVar10;
        while (bVar18 = sVar17 != 0, sVar17 = sVar17 - 1, bVar18) {
          StringParser::parseNumber<long>((string *)&msg,sVar16 + 1,false);
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(&titles,sVar16);
          std::__cxx11::string::operator=((string *)pvVar9,(string *)&msg);
          std::__cxx11::string::~string((string *)&msg);
          sVar16 = sVar16 + 1;
        }
      }
      for (sVar16 = 0;
          (sVar10 != sVar16 &&
          ((long)sVar16 <
           ((long)(this->_tracker)._statistics.
                  super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)(this->_tracker)._statistics.
                 super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0xe8)); sVar16 = sVar16 + 1) {
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&titles,sVar16);
        std::__cxx11::string::string((string *)&local_278,(string *)pvVar9);
        MultivariateTracker::setName(&this->_tracker,sVar16,&local_278);
        std::__cxx11::string::~string((string *)&local_278);
      }
      if (2 < (int)Logger::logLevel) {
        std::__cxx11::stringstream::stringstream((stringstream *)&msg);
        poVar6 = std::operator<<((ostream *)local_488._M_local_buf,
                                 (string *)&ApplicationProperties::NAME_abi_cxx11_);
        poVar6 = std::operator<<(poVar6," is complete");
        std::endl<char,std::char_traits<char>>(poVar6);
        Logger::log((double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14));
        std::__cxx11::stringbuf::str();
        std::operator<<(extraout_RAX_14,(string *)&line);
        std::__cxx11::string::~string((string *)&line);
        std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
      }
      std::_Vector_base<DataPoint,_std::allocator<DataPoint>_>::~_Vector_base
                ((_Vector_base<DataPoint,_std::allocator<DataPoint>_> *)&dataMasked);
      std::_Vector_base<DataPoint,_std::allocator<DataPoint>_>::~_Vector_base
                ((_Vector_base<DataPoint,_std::allocator<DataPoint>_> *)&data);
      std::__cxx11::string::~string((string *)&lineToReshape);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&parser._tokens);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&titles);
      std::__cxx11::string::~string((string *)&writer);
      std::ifstream::~ifstream((ifstream *)&fileInput);
      return 0;
    }
  } while( true );
}

Assistant:

int
    run(void)
    {

        // ==================================================
        // Application parameters
        // --------------------------------------------------
        int numDim = 0;
        int numDimMask = 0;

        // ==================================================
        // Define input stream
        // --------------------------------------------------
        std::ifstream fileInput(this->_options.fileInput.c_str(), std::ios::in);
        std::istream * source = (fileInput.good() ? &fileInput : &std::cin);

        LOG_MESSAGE(Logger::Level::INFO, ApplicationProperties::NAME << " is starting");

        // ==================================================
        // Define output writer
        // --------------------------------------------------
        StatisticsWriter writer;

        // ==================================================
        // Define row sampler
        // --------------------------------------------------
        RowSampler sampler(this->_options.sampling);

        // ==================================================
        // Loop through source data
        // --------------------------------------------------
        
        // titles is populated by parsed line if user provides a titles row, otherwise indices are used
        std::vector<std::string> titles;
        StringSplitter parser;
        
        // Counters used to keep track of line reads if reshaping is requested by user
        unsigned int counter = 0;
        unsigned int counterSinceLastParsing = 0;
        std::string lineToReshape = "";
        
        // DataVector contains the parsed data from each line.
        // It's size will get set on the first successful parsing.
        DataVector data;
        DataVector dataMasked;
        
        bool reading = true;
        while (reading)
        {

            // ==================================================
            // Extract current line
            // --------------------------------------------------
            std::string line = StatisticsApp::readline(*source);
            if (!(*source).good())
            {
                LOG_MESSAGE(Logger::Level::DETAIL, "End of file found. Exiting.");
                break;
            }

            // ==================================================
            // Check if line is empty and if we need to exit
            // --------------------------------------------------
            if (line.size() == 0)
            {
                if (this->_options.blankEOF)
                {
                    LOG_MESSAGE(Logger::Level::DETAIL, "Blank line found. Exiting.");
                    break;
                }
                else
                {
                    LOG_MESSAGE(Logger::Level::DETAIL, "Blank line found. Skipping.");
                    continue;
                }
            }
            
            // ==================================================
            // Check if row is comment and needs to be skipped
            // --------------------------------------------------
            if (line.compare(0,1,this->_options.comment.c_str()) == 0) continue;
            
            // ==================================================
            // Check if row needs to be reshaped into column
            // --------------------------------------------------

            // If yes, then append current line to previous
            // lines with delimiter and continue to next read
            counterSinceLastParsing++;
            lineToReshape += (counterSinceLastParsing == 1 ? "" : this->_options.delimiter) + line;
            if (counterSinceLastParsing < this->_options.numLinesToReshape) continue;

            // Prepare line and counter for parsing
            line = lineToReshape;
            counter++;

            // Reset counter and appended line for next read
            counterSinceLastParsing = 0;
            lineToReshape = "";

            // ==================================================
            // Extract header titles
            // --------------------------------------------------
            if (this->_options.headerRow == counter)
            {
                parser.initialize(line, this->_options.delimiter, this->_options.removeDuplicates, this->_options.filterColumns);
                titles = parser.tokens();
                continue;
            }
            
            // ==================================================
            // Skip header rows
            // --------------------------------------------------
            if (counter <= this->_options.numLinesToSkip)
            {
                LOG_MESSAGE(Logger::Level::INFO, "Skipping header line.");
                continue;
            }

            // ==================================================
            // Skip unneeded rows
            // --------------------------------------------------
            if (counter > (this->_options.numLinesToSkip + this->_options.numLinesToKeep))
            {
                LOG_MESSAGE(Logger::Level::INFO, "Skipping remaining lines.");
                break;
            }

            // ==================================================
            // Skip unsampled rows
            // --------------------------------------------------
            if (!sampler.sample())
            {
                LOG_MESSAGE(Logger::Level::DETAIL, "Row not sampled. Skipping");
                continue;
            }

            // ==================================================
            // Parse current line
            // --------------------------------------------------
            parser.initialize(line, this->_options.delimiter, this->_options.removeDuplicates);
            StringSplitter::size_type numTokens = parser.size();
            LOG_MESSAGE(Logger::Level::DETAIL, "Line = " << counter << " - content =\"" << line << "\"");

            // ==================================================
            // Check and compute source data dimensions
            // --------------------------------------------------
            bool isDimSet = numDim > 0;
            if (!isDimSet)
            {
                numDim = (int) numTokens;
                data.resize(numDim);

                // Make sure we only keep column filters if they are within actual number of columns
                this->_options.filterColumns.resize(numDim, (this->_options.filterColumns.size() == 0));

                // Compute how many columns are masked out
                numDimMask = std::accumulate(this->_options.filterColumns.begin(), this->_options.filterColumns.end(), 0);
                dataMasked.resize(numDimMask);

                LOG_MESSAGE(Logger::Level::INFO, "Data dimensions set to " << numDim);
                LOG_MESSAGE(Logger::Level::INFO, "Mask dimensions set to " << numDimMask);
            }

            bool isDimFailed = (numDim != (int) numTokens);
            if (isDimFailed)
            {
                LOG_MESSAGE(Logger::Level::WARNING, "Line = " << counter << " - Statistics dimensions does not equal data dimensions." << (this->_options.strictParsing ? " Skipping." : ""));
                if (this->_options.strictParsing)
                {
                    continue;
                }
            }

            LOG_MESSAGE(Logger::Level::DEBUG, "Line = " << counter << " - Number of tokens found: " << numTokens);

            // ==================================================
            // Apply string filters
            // --------------------------------------------------
            bool isStringFiltered = this->_options.filterRows.isFiltered(parser.get());
            if (!isStringFiltered)
            {
                LOG_MESSAGE(Logger::Level::DEBUG, "Line = " << counter << " - filtered out by string filter");
                continue;
            }

            // ==================================================
            // Convert tokens into data array
            // --------------------------------------------------
            for (StringSplitter::size_type i = 0; i < (StringSplitter::size_type) numDim; ++i)
            {

                if (numTokens <= i) break;

                data.at(i).active = parser.toValue<double>(i, data.at(i).value);

                LOG_MESSAGE(Logger::Level::DETAIL, "Line = " << counter << " - " << (data.at(i).active ? "Valid token" : "Invalid token") << " = " << parser.at(i));

            }

            // ==================================================
            // Apply numeric filters
            // --------------------------------------------------
            bool isNumericFiltered = this->_options.filterRows.isFiltered(data);
            if (!isNumericFiltered)
            {
                LOG_MESSAGE(Logger::Level::DEBUG, "Line = " << counter << " - filtered out by numeric filter");
                continue;
            }

            // ==================================================
            // Apply column filters
            // --------------------------------------------------
            DataVector::copy(data, numDim, dataMasked, numDimMask, this->_options.filterColumns, numDim);

            // ==================================================
            // Write current data
            // --------------------------------------------------
            if (this->_options.showFilteredData)
            {
                writer.writeData(*this->_outputStream, dataMasked);
            }

            // ==================================================
            // Update statistics with current data
            // --------------------------------------------------
            this->_tracker.update(dataMasked);

            // Since the data vector is preallocated, we deactivate all entries in case they don't exist in the next parsed line
            // This way they don't get inadvertently included in the next line's statistics
            data.deactivate();

        }

        // ==================================================
        // Update statistics names
        // --------------------------------------------------
        if (numDimMask != (long)titles.size())
        {
            // Show error message if user provided a bad header row
            if (this->_options.headerRow > 0)
            {
                LOG_MESSAGE(Logger::Level::ERROR, "Size of header titles does not match data dimensions so using indices as header titles.");
            }
            titles.resize(numDimMask,"");
            for (long i = 0; i < numDimMask; i++)
            {
                titles.at(i) = StringParser::parseNumber<long>(i+1);
            }
        }
        for (long i = 0; i < numDimMask && i < this->_tracker.getDimension(); i++)
        {
            this->_tracker.setName(i, titles.at(i));
        }

        LOG_MESSAGE(Logger::Level::INFO, ApplicationProperties::NAME << " is complete");
    
        return 0;
        
    }